

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O2

spv_result_t spvtools::val::CompositesPass(ValidationState_t *_,Instruction *inst)

{
  uint32_t *puVar1;
  ushort uVar2;
  pointer psVar3;
  pointer psVar4;
  bool bVar5;
  int32_t iVar6;
  uint uVar7;
  uint32_t uVar8;
  spv_result_t sVar9;
  uint32_t uVar10;
  uint uVar11;
  Op OVar12;
  uint32_t uVar13;
  Instruction *pIVar14;
  Instruction *pIVar15;
  Instruction *pIVar16;
  uint uVar17;
  uint *puVar18;
  uint *puVar19;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  pointer operand_index;
  uint32_t result_num_cols;
  uint local_250;
  _Head_base<2UL,_unsigned_int,_false> local_24c;
  uint32_t local_248;
  uint32_t result_component_type;
  uint32_t result_col_type;
  uint32_t matrix_component_type;
  uint32_t matrix_num_cols;
  uint32_t matrix_num_rows;
  uint32_t member_type;
  uint uStack_22c;
  uint32_t matrix_col_type;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  uVar2 = (inst->inst_).opcode;
  uVar17 = uVar2 - 0x4d;
  if (uVar17 < 8) {
    puVar18 = (uint *)((long)&switchD_0053a040::switchdataD_007cca94 +
                      (long)(int)(&switchD_0053a040::switchdataD_007cca94)[uVar17]);
    switch((uint)uVar2) {
    case 0x4d:
      uVar8 = (inst->inst_).type_id;
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
      iVar6 = spvOpcodeIsScalarType(OVar12);
      if (iVar6 == 0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Result Type to be a scalar type";
      }
      else {
        uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
        OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
        if ((OVar12 == OpTypeVector) || (OVar12 == OpTypeCooperativeVectorNV)) {
          uVar10 = ValidationState_t::GetComponentType(_,uVar10);
          if (uVar10 == uVar8) {
            uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,3);
            pIVar14 = ValidationState_t::FindDef(_,uVar17);
            if (((pIVar14 == (Instruction *)0x0) || (uVar8 = (pIVar14->inst_).type_id, uVar8 == 0))
               || (bVar5 = ValidationState_t::IsIntScalarType(_,uVar8), !bVar5)) {
LAB_0053a9a5:
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar20 = "Expected Index to be int scalar";
            }
            else {
              bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
              if (!bVar5) {
                return SPV_SUCCESS;
              }
              bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
              if (!bVar5) {
                return SPV_SUCCESS;
              }
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar20 = "Cannot extract from a vector of 8- or 16-bit types";
            }
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected Vector component type to be equal to Result Type";
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Expected Vector type to be OpTypeVector";
        }
      }
      break;
    case 0x4e:
      uVar8 = (inst->inst_).type_id;
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
      if ((OVar12 == OpTypeVector) || (OVar12 == OpTypeCooperativeVectorNV)) {
        uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
        if (uVar10 == uVar8) {
          uVar10 = ValidationState_t::GetOperandTypeId(_,inst,3);
          uVar8 = ValidationState_t::GetComponentType(_,uVar8);
          if (uVar8 == uVar10) {
            uVar8 = ValidationState_t::GetOperandTypeId(_,inst,4);
            bVar5 = ValidationState_t::IsIntScalarType(_,uVar8);
            if (!bVar5) goto LAB_0053a9a5;
            bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Cannot insert into a vector of 8- or 16-bit types";
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)local_208,
                            "Expected Component type to be equal to Result Type ");
            pcVar20 = "component type";
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Expected Vector type to be equal to Result Type";
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Result Type to be OpTypeVector";
      }
      break;
    case 0x4f:
      pIVar14 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
      if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x17)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,"The Result Type of OpVectorShuffle must be");
        std::operator<<((ostream *)local_208," OpTypeVector. Found Op");
        pcVar20 = spvOpcodeString((uint)(pIVar14->inst_).opcode);
        std::operator<<((ostream *)local_208,pcVar20);
LAB_0053a7e1:
        std::operator<<((ostream *)local_208,".");
        goto LAB_0053aed4;
      }
      psVar3 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      psVar4 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
      if (((long)psVar3 - (long)psVar4 >> 4) - 4U != (ulong)uVar17) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,
                        "OpVectorShuffle component literals count does not match Result Type <id> ")
        ;
        ValidationState_t::getIdName_abi_cxx11_((string *)&member_type,_,(pIVar14->inst_).result_id)
        ;
        std::operator<<((ostream *)local_208,(string *)&member_type);
        std::operator<<((ostream *)local_208,"s vector component count.");
        std::__cxx11::string::_M_dispose();
        goto LAB_0053aed4;
      }
      uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar15 = ValidationState_t::FindDef(_,uVar17);
      pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
      uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      pIVar16 = ValidationState_t::FindDef(_,uVar17);
      pIVar16 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
      if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x17)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar20 = "The type of Vector 1 must be OpTypeVector.";
      }
      else if ((pIVar16 == (Instruction *)0x0) || ((pIVar16->inst_).opcode != 0x17)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar20 = "The type of Vector 2 must be OpTypeVector.";
      }
      else {
        uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
        if (uVar11 == uVar17) {
          uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
          if (uVar11 == uVar17) {
            uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
            uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,2);
            uVar22 = 4;
            do {
              if ((ulong)((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar22) {
                bVar5 = EnumSet<spv::Capability>::contains
                                  (&_->module_capabilities_,CapabilityShader);
                if (!bVar5) {
                  return SPV_SUCCESS;
                }
                bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id)
                ;
                if (!bVar5) {
                  return SPV_SUCCESS;
                }
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar20 = "Cannot shuffle a vector of 8- or 16-bit types";
                goto LAB_0053aec2;
              }
              uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,uVar22);
              uVar22 = uVar22 + 1;
            } while ((uVar7 == 0xffffffff) || (uVar7 < uVar11 + uVar17));
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)local_208,"Component index ");
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::operator<<((ostream *)local_208," is out of bounds for ");
            std::operator<<((ostream *)local_208,"combined (Vector1 + Vector2) size of ");
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            goto LAB_0053a7e1;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar20 = "The Component Type of Vector 2 must be the same as ResultType.";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar20 = "The Component Type of Vector 1 must be the same as ResultType.";
        }
      }
      break;
    case 0x50:
      uVar22 = (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar8 = (inst->inst_).type_id;
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
      uVar17 = (uint)uVar22;
      puVar19 = &switchD_0053a443::switchdataD_007ccab4;
      switch(OVar12) {
      case OpTypeVector:
switchD_0053a443_caseD_17:
        uVar10 = ValidationState_t::GetDimension(_,uVar8);
        local_248 = ValidationState_t::GetComponentType(_,uVar8);
        if (OVar12 == OpTypeVector) {
          if (uVar17 < 4) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected number of constituents to be at least 2";
            break;
          }
          local_250 = 0;
          local_24c._M_head_impl = uVar10;
        }
        else {
          pIVar14 = ValidationState_t::FindDef(_,uVar8);
          uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
          ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar17)
          ;
          local_24c._M_head_impl = local_208._0_4_;
          local_250 = (uint)CONCAT71((int7)((ulong)puVar19 >> 8),local_208[4]) ^ 1;
        }
        uVar8 = 0;
        for (uVar21 = 2; uVar21 < (uVar22 & 0xffffffff); uVar21 = uVar21 + 1) {
          uVar10 = ValidationState_t::GetOperandTypeId(_,inst,uVar21);
          uVar13 = 1;
          if (uVar10 != local_248) {
            OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
            if ((OVar12 != OpTypeVector) ||
               (uVar13 = ValidationState_t::GetComponentType(_,uVar10), uVar13 != local_248)) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::operator<<((ostream *)local_208,
                              "Expected Constituents to be scalars or vectors of");
              std::operator<<((ostream *)local_208," the same type as Result Type components");
              goto LAB_0053aed4;
            }
            uVar13 = ValidationState_t::GetDimension(_,uVar10);
          }
          uVar8 = uVar8 + uVar13;
        }
        if ((char)local_250 == '\0' && local_24c._M_head_impl != uVar8) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)local_208,
                          "Expected total number of given components to be equal ");
          pcVar20 = "to the size of Result Type vector";
        }
        else {
LAB_0053b0c4:
          bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Cannot create a composite containing 8- or 16-bit types";
        }
        break;
      case OpTypeMatrix:
        _member_type = _member_type & 0xffffffff00000000;
        result_num_cols = 0;
        result_col_type = 0;
        result_component_type = 0;
        bVar5 = ValidationState_t::GetMatrixTypeInfo
                          (_,uVar8,&member_type,&result_num_cols,&result_col_type,
                           &result_component_type);
        if (!bVar5) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x114,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if (result_num_cols + 2 == uVar17) {
          uVar21 = 2;
          do {
            if ((uVar22 & 0xffffffff) <= uVar21) goto LAB_0053b0c4;
            uVar8 = ValidationState_t::GetOperandTypeId(_,inst,uVar21);
            uVar21 = uVar21 + 1;
          } while (uVar8 == result_col_type);
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)local_208,
                          "Expected Constituent type to be equal to the column ");
          pcVar20 = "type Result Type matrix";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)local_208,"Expected total number of Constituents to be equal ")
          ;
          pcVar20 = "to the number of columns of Result Type matrix";
        }
        break;
      case OpTypeImage:
      case OpTypeSampler:
      case OpTypeSampledImage:
      case OpTypeRuntimeArray:
switchD_0053a443_caseD_19:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Result Type to be a composite type";
        break;
      case OpTypeArray:
        pIVar14 = ValidationState_t::FindDef(_,uVar8);
        if (pIVar14 == (Instruction *)0x0) {
          __assert_fail("array_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,299,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if ((pIVar14->inst_).opcode != 0x1c) {
          __assert_fail("array_inst->opcode() == spv::Op::OpTypeArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,300,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        pIVar15 = ValidationState_t::FindDef
                            (_,(pIVar14->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[3]);
        iVar6 = spvOpcodeIsSpecConstant((uint)(pIVar15->inst_).opcode);
        if (iVar6 != 0) goto LAB_0053b0c4;
        _member_type = (pointer)0x0;
        bVar5 = ValidationState_t::EvalConstantValUint64
                          (_,(pIVar14->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[3],(uint64_t *)&member_type);
        if (!bVar5) {
          __assert_fail("0 && \"Array type definition is corrupt\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x136,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if (_member_type + 2 == (pointer)(uVar22 & 0xffffffff)) {
          uVar8 = (pIVar14->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[2];
          operand_index = (pointer)0x2;
          do {
            if ((pointer)(uVar22 & 0xffffffff) <= operand_index) goto LAB_0053b0c4;
            uVar10 = ValidationState_t::GetOperandTypeId(_,inst,(size_t)operand_index);
            operand_index = operand_index + 1;
          } while (uVar10 == uVar8);
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)local_208,
                          "Expected Constituent type to be equal to the column ");
          pcVar20 = "type Result Type array";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)local_208,"Expected total number of Constituents to be equal ")
          ;
          pcVar20 = "to the number of elements of Result Type array";
        }
        break;
      case OpTypeStruct:
        pIVar14 = ValidationState_t::FindDef(_,uVar8);
        if (pIVar14 == (Instruction *)0x0) {
          __assert_fail("struct_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x14e,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if ((pIVar14->inst_).opcode != 0x1e) {
          __assert_fail("struct_inst->opcode() == spv::Op::OpTypeStruct",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x14f,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar21 = ((long)(pIVar14->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pIVar14->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) + 1;
        if (uVar21 == (uVar22 & 0xffffffff)) {
          uVar22 = 2;
          do {
            if (uVar21 <= uVar22) goto LAB_0053b0c4;
            uVar8 = ValidationState_t::GetOperandTypeId(_,inst,uVar22);
            puVar1 = (pIVar14->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar22;
            uVar22 = uVar22 + 1;
          } while (uVar8 == *puVar1);
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)local_208,"Expected Constituent type to be equal to the ");
          pcVar20 = "corresponding member type of Result Type struct";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)local_208,"Expected total number of Constituents to be equal ")
          ;
          pcVar20 = "to the number of members of Result Type struct";
        }
        break;
      default:
        if (OVar12 == OpTypeCooperativeMatrixKHR) {
          pIVar14 = ValidationState_t::FindDef(_,uVar8);
          if (pIVar14 == (Instruction *)0x0) {
            __assert_fail("result_type_inst",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                          ,0x166,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                         );
          }
          uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
          if (uVar17 == 3) {
LAB_0053adc2:
            uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
            if (uVar8 == uVar11) goto LAB_0053b0c4;
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected Constituent type to be equal to the component type";
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Must be only one constituent";
          }
        }
        else {
          if (OVar12 != OpTypeCooperativeMatrixNV) {
            puVar19 = puVar18;
            if (OVar12 != OpTypeCooperativeVectorNV) goto switchD_0053a443_caseD_19;
            goto switchD_0053a443_caseD_17;
          }
          pIVar14 = ValidationState_t::FindDef(_,uVar8);
          if (pIVar14 == (Instruction *)0x0) {
            __assert_fail("result_type_inst",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                          ,0x179,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                         );
          }
          uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
          if (uVar17 == 3) goto LAB_0053adc2;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Expected single constituent";
        }
      }
      break;
    case 0x51:
      _member_type = (pointer)((ulong)uStack_22c << 0x20);
      sVar9 = anon_unknown_1::GetExtractInsertValueType(_,inst,&member_type);
      if (sVar9 != SPV_SUCCESS) {
        return sVar9;
      }
      uVar8 = (inst->inst_).type_id;
      uVar10 = member_type;
      if (uVar8 == member_type) {
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Cannot extract from a composite of 8- or 16-bit types";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)local_208,"Result type (Op");
        OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
        pcVar20 = spvOpcodeString(OVar12);
        std::operator<<((ostream *)local_208,pcVar20);
        pcVar20 = ") does not match the type that results from indexing into the composite (Op";
LAB_0053ae97:
        std::operator<<((ostream *)local_208,pcVar20);
        OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
        pcVar20 = spvOpcodeString(OVar12);
        std::operator<<((ostream *)local_208,pcVar20);
        pcVar20 = ").";
      }
      break;
    case 0x52:
      uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
      uVar10 = ValidationState_t::GetOperandTypeId(_,inst,3);
      if ((inst->inst_).type_id == uVar10) {
        _member_type = _member_type & 0xffffffff00000000;
        sVar9 = anon_unknown_1::GetExtractInsertValueType(_,inst,&member_type);
        if (sVar9 != SPV_SUCCESS) {
          return sVar9;
        }
        uVar10 = member_type;
        if (uVar8 != member_type) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::operator<<((ostream *)local_208,"The Object type (Op");
          OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
          pcVar20 = spvOpcodeString(OVar12);
          std::operator<<((ostream *)local_208,pcVar20);
          pcVar20 = ") does not match the type that results from indexing into the Composite (Op";
          goto LAB_0053ae97;
        }
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Cannot insert into a composite of 8- or 16-bit types";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)local_208,
                        "The Result Type must be the same as Composite type in Op");
        pcVar20 = spvOpcodeString((uint)(inst->inst_).opcode);
        std::operator<<((ostream *)local_208,pcVar20);
        std::operator<<((ostream *)local_208," yielding Result Id ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        pcVar20 = ".";
      }
      break;
    case 0x53:
      uVar8 = (inst->inst_).type_id;
      uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
      if (uVar10 == uVar8) {
        bVar5 = ValidationState_t::IsVoidType(_,uVar8);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "OpCopyObject cannot have void result type";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Result Type and Operand type to be the same";
      }
      break;
    case 0x54:
      _member_type = (pointer)((ulong)uStack_22c << 0x20);
      result_num_cols = 0;
      result_col_type = 0;
      result_component_type = 0;
      bVar5 = ValidationState_t::GetMatrixTypeInfo
                        (_,(inst->inst_).type_id,&member_type,&result_num_cols,&result_col_type,
                         &result_component_type);
      if (bVar5) {
        uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
        matrix_num_rows = 0;
        matrix_num_cols = 0;
        matrix_col_type = 0;
        matrix_component_type = 0;
        bVar5 = ValidationState_t::GetMatrixTypeInfo
                          (_,uVar8,&matrix_num_rows,&matrix_num_cols,&matrix_col_type,
                           &matrix_component_type);
        if (bVar5) {
          if (result_component_type == matrix_component_type) {
            if ((member_type == matrix_num_cols) && (result_num_cols == matrix_num_rows)) {
              bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
              if (!bVar5) {
                return SPV_SUCCESS;
              }
              bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
              if (!bVar5) {
                return SPV_SUCCESS;
              }
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar20 = "Cannot transpose matrices of 16-bit floats";
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::operator<<((ostream *)local_208,
                              "Expected number of columns and the column size of Matrix ");
              pcVar20 = "to be the reverse of those of Result Type";
            }
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)local_208,
                            "Expected component types of Matrix and Result Type to be ");
            pcVar20 = "identical";
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Expected Matrix to be of type OpTypeMatrix";
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Result Type to be a matrix type";
      }
    }
  }
  else {
    if (uVar2 != 400) {
      return SPV_SUCCESS;
    }
    pIVar14 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar15 = ValidationState_t::FindDef(_,uVar17);
    pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
    if (((pIVar15 == pIVar14) || (pIVar14 == (Instruction *)0x0)) || (pIVar15 == (Instruction *)0x0)
       ) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar20 = "Result Type must not equal the Operand type";
    }
    else {
      bVar5 = ValidationState_t::LogicallyMatch(_,pIVar15,pIVar14,false);
      if (bVar5) {
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Cannot copy composites of 8- or 16-bit types";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar20 = "Result Type does not logically match the Operand type";
      }
    }
  }
LAB_0053aec2:
  std::operator<<((ostream *)local_208,pcVar20);
LAB_0053aed4:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t CompositesPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVectorExtractDynamic:
      return ValidateVectorExtractDynamic(_, inst);
    case spv::Op::OpVectorInsertDynamic:
      return ValidateVectorInsertDyanmic(_, inst);
    case spv::Op::OpVectorShuffle:
      return ValidateVectorShuffle(_, inst);
    case spv::Op::OpCompositeConstruct:
      return ValidateCompositeConstruct(_, inst);
    case spv::Op::OpCompositeExtract:
      return ValidateCompositeExtract(_, inst);
    case spv::Op::OpCompositeInsert:
      return ValidateCompositeInsert(_, inst);
    case spv::Op::OpCopyObject:
      return ValidateCopyObject(_, inst);
    case spv::Op::OpTranspose:
      return ValidateTranspose(_, inst);
    case spv::Op::OpCopyLogical:
      return ValidateCopyLogical(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}